

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

string * __thiscall
util::str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
          (string *__return_storage_ptr__,util *this,char (*args) [27],char (*args_1) [87],
          char (*args_2) [2],int *args_3,char (*args_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  size_t sVar1;
  ostringstream ss;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar1);
  sVar1 = strlen(*args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,*args,sVar1);
  sVar1 = strlen(*args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,*args_1,sVar1);
  std::ostream::operator<<((ostream *)local_1a8,*(int *)args_2);
  sVar1 = strlen((char *)args_3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)args_3,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,*(char **)args_4,*(long *)(args_4[2] + 2));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}